

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

void testing::internal::
     GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<google::HashtableInterface_DenseHashtable<std::__cxx11::string,std::__cxx11::string,kEmptyString,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>>>
               (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *param_1)

{
  int in_stack_ffffffffffffffcc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  DefaultNameGenerator::
  GetName<google::HashtableInterface_DenseHashtable<std::__cxx11::string,std::__cxx11::string,kEmptyString,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>>
            (in_stack_ffffffffffffffcc);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(param_1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void GenerateNamesRecursively(Types, std::vector<std::string>* result, int i) {
  result->push_back(NameGenerator::template GetName<typename Types::Head>(i));
  GenerateNamesRecursively<NameGenerator>(typename Types::Tail(), result,
                                          i + 1);
}